

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int float32_is_signaling_nan_m68k(float32 a_,float_status *status)

{
  return (int)((a_ & 0x3fffff) != 0 && (a_ & 0x7fc00000) == 0x7f800000);
}

Assistant:

int float32_is_signaling_nan(float32 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint32_t a = float32_val(a_);
    if (snan_bit_is_one(status)) {
        return ((uint32_t)(a << 1) >= 0xFF800000);
    } else {
        return (((a >> 22) & 0x1FF) == 0x1FE) && (a & 0x003FFFFF);
    }
#endif
}